

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O0

vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *
s2textformat::ParsePointsOrDie
          (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *__return_storage_ptr__,
          string_view str)

{
  bool bVar1;
  ostream *poVar2;
  absl *this;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *in_RCX;
  size_type sVar3;
  string_view str_00;
  string_view piece;
  S2LogMessage local_58;
  S2LogMessageVoidify local_45 [13];
  s2textformat *local_38;
  char *pcStack_30;
  undefined1 local_21;
  s2textformat *psStack_20;
  string_view str_local;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices;
  
  str_local.ptr_ = (char *)str.length_;
  psStack_20 = (s2textformat *)str.ptr_;
  local_21 = 0;
  str_local.length_ = (size_type)__return_storage_ptr__;
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::vector(__return_storage_ptr__);
  local_38 = psStack_20;
  pcStack_30 = str_local.ptr_;
  str_00.length_ = (size_type)__return_storage_ptr__;
  str_00.ptr_ = str_local.ptr_;
  bVar1 = ParsePoints(psStack_20,str_00,in_RCX);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return __return_storage_ptr__;
  }
  sVar3 = 3;
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
             ,0x51,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_58);
  poVar2 = std::operator<<(poVar2,"Check failed: ParsePoints(str, &vertices) ");
  this = (absl *)std::operator<<(poVar2,": str == \"");
  piece.length_ = sVar3;
  piece.ptr_ = str_local.ptr_;
  poVar2 = absl::operator<<(this,(ostream *)psStack_20,piece);
  poVar2 = std::operator<<(poVar2,"\"");
  S2LogMessageVoidify::operator&(local_45,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_58);
}

Assistant:

vector<S2Point> ParsePointsOrDie(string_view str) {
  vector<S2Point> vertices;
  S2_CHECK(ParsePoints(str, &vertices)) << ": str == \"" << str << "\"";
  return vertices;
}